

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O1

void Fraig_FeedBack(Fraig_Man_t *p,int *pModel,Msat_IntVec_t *vVars,Fraig_Node_t *pOld,
                   Fraig_Node_t *pNew)

{
  undefined1 *puVar1;
  uint uVar2;
  Fraig_Node_t *pFVar3;
  Msat_IntVec_t *p_00;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  Fraig_NodeVec_t *pFVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  timespec ts;
  long local_50;
  timespec local_48;
  long local_38;
  
  iVar4 = clock_gettime(3,&local_48);
  if (iVar4 < 0) {
    local_50 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    local_50 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  pFVar10 = p->vInputs;
  if (0 < pFVar10->nSize) {
    lVar11 = 0;
    do {
      puVar1 = &pFVar10->pArray[lVar11]->field_0x18;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xffffff7f;
      lVar11 = lVar11 + 1;
      pFVar10 = p->vInputs;
    } while (lVar11 < pFVar10->nSize);
  }
  uVar5 = Msat_IntVecReadSize(vVars);
  piVar8 = Msat_IntVecReadArray(vVars);
  if ((int)uVar5 < 1) {
    uVar5 = 1;
  }
  else {
    uVar13 = 0;
    iVar4 = 0;
    do {
      pFVar3 = p->vNodes->pArray[piVar8[uVar13]];
      iVar6 = Fraig_NodeIsVar(pFVar3);
      if (iVar6 != 0) {
        uVar2 = *(uint *)&pFVar3->field_0x18;
        *(uint *)&pFVar3->field_0x18 = uVar2 | 0x80;
        *(uint *)&pFVar3->field_0x18 =
             (uVar2 & 0xfffffeff | 0x80 | (pModel[piVar8[uVar13]] & 1U) << 8) ^ 0x100;
        iVar4 = iVar4 + 1;
      }
      uVar13 = uVar13 + 1;
    } while (uVar5 != uVar13);
    uVar5 = iVar4 + 1;
  }
  iVar6 = (((int)uVar5 >> 5) + 1) - (uint)((uVar5 & 0x1f) == 0);
  iVar4 = p->nWordsDyna - p->iWordStart;
  if (iVar6 < iVar4) {
    iVar4 = iVar6;
  }
  Msat_IntVecPush(p->vPatsReal,p->iWordStart << 5);
  p->pSimsReal[p->iWordStart] = p->pSimsReal[p->iWordStart] | 1;
  pFVar10 = p->vInputs;
  if (0 < pFVar10->nSize) {
    iVar6 = 1;
    lVar11 = 0;
    local_38 = (long)iVar4;
    do {
      pFVar3 = pFVar10->pArray[lVar11];
      iVar7 = p->iWordStart;
      if (0 < iVar4) {
        lVar12 = (long)iVar7;
        do {
          if ((char)*(uint *)&pFVar3->field_0x18 < '\0') {
            if ((*(uint *)&pFVar3->field_0x18 >> 8 & 1) == 0) {
              pFVar3->puSimD[lVar12] = 0;
            }
            else {
              pFVar3->puSimD[lVar12] = 0xffffffff;
            }
          }
          else {
            uVar5 = Aig_ManRandom(0);
            pFVar3->puSimD[lVar12] = uVar5;
          }
          lVar12 = lVar12 + 1;
          iVar7 = p->iWordStart;
        } while (lVar12 < iVar7 + iVar4);
      }
      if (((pFVar3->field_0x18 & 0x80) != 0) && (iVar6 < iVar4 * 0x20 + -2)) {
        pFVar3->puSimD[(long)iVar7 + (long)(iVar6 >> 5)] =
             pFVar3->puSimD[(long)iVar7 + (long)(iVar6 >> 5)] ^ 1 << ((byte)iVar6 & 0x1f);
        iVar6 = iVar6 + 1;
      }
      pFVar3->field_0x18 = pFVar3->field_0x18 & 0x7f;
      if (0 < iVar4) {
        lVar9 = (long)p->iWordStart;
        lVar12 = lVar9 + local_38;
        uVar5 = pFVar3->uHashD;
        do {
          uVar5 = uVar5 ^ s_FraigPrimes[lVar9] * pFVar3->puSimD[lVar9];
          pFVar3->uHashD = uVar5;
          lVar9 = lVar9 + 1;
        } while (lVar9 < lVar12);
      }
      lVar11 = lVar11 + 1;
      pFVar10 = p->vInputs;
    } while (lVar11 < pFVar10->nSize);
  }
  if (p->nWordsDyna < p->iWordStart + iVar4) {
    __assert_fail("p->iWordStart + nWords <= p->nWordsDyna",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fraig/fraigFeed.c"
                  ,0x5b,
                  "void Fraig_FeedBack(Fraig_Man_t *, int *, Msat_IntVec_t *, Fraig_Node_t *, Fraig_Node_t *)"
                 );
  }
  pFVar10 = p->vNodes;
  if (1 < pFVar10->nSize) {
    lVar11 = 1;
    do {
      iVar6 = Fraig_NodeIsAnd(pFVar10->pArray[lVar11]);
      if (iVar6 != 0) {
        Fraig_NodeSimulate(p->vNodes->pArray[lVar11],p->iWordStart,p->iWordStart + iVar4,0);
      }
      lVar11 = lVar11 + 1;
      pFVar10 = p->vNodes;
    } while (lVar11 < pFVar10->nSize);
  }
  if (p->fDoSparse != 0) {
    Fraig_TableRehashF0(p,0);
  }
  if (p->fChoicing == 0) {
    p_00 = p->vPatsReal;
    iVar6 = Msat_IntVecReadSize(p_00);
    Msat_IntVecReadEntry(p_00,iVar6 + -1);
  }
  iVar4 = iVar4 + p->iWordStart;
  if (iVar4 == p->nWordsDyna) {
    iVar4 = Fraig_FeedBackCompress(p);
  }
  p->iWordStart = iVar4;
  iVar4 = clock_gettime(3,&local_48);
  if (iVar4 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p->timeFeed = p->timeFeed + lVar11 + local_50;
  return;
}

Assistant:

void Fraig_FeedBack( Fraig_Man_t * p, int * pModel, Msat_IntVec_t * vVars, Fraig_Node_t * pOld, Fraig_Node_t * pNew )
{
    int nVarsPi, nWords;
    int i;
    abctime clk = Abc_Clock();

    // get the number of PI vars in the feedback (also sets the PI values)
    nVarsPi = Fraig_FeedBackPrepare( p, pModel, vVars );

    // set the PI values
    nWords = Fraig_FeedBackInsert( p, nVarsPi );
    assert( p->iWordStart + nWords <= p->nWordsDyna );

    // resimulates the words from p->iWordStart to iWordStop
    for ( i = 1; i < p->vNodes->nSize; i++ )
        if ( Fraig_NodeIsAnd(p->vNodes->pArray[i]) )
            Fraig_NodeSimulate( p->vNodes->pArray[i], p->iWordStart, p->iWordStart + nWords, 0 );

    if ( p->fDoSparse )
        Fraig_TableRehashF0( p, 0 );

    if ( !p->fChoicing )
    Fraig_FeedBackVerify( p, pOld, pNew );

    // if there is no room left, compress the patterns
    if ( p->iWordStart + nWords == p->nWordsDyna )
        p->iWordStart = Fraig_FeedBackCompress( p );
    else  // otherwise, update the starting word
        p->iWordStart += nWords;

p->timeFeed += Abc_Clock() - clk;
}